

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strict_fstream.hpp
# Opt level: O0

void __thiscall strict_fstream::Exception::Exception(Exception *this,string *msg)

{
  string *in_RSI;
  exception *in_RDI;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__Exception_0096d3f0;
  std::__cxx11::string::string((string *)(in_RDI + 8),in_RSI);
  return;
}

Assistant:

Exception(const std::string& msg) : _msg(msg) {}